

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::loadFinalSchema(Node *this,SchemaLoader *loader)

{
  uint uVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  ErrorReporter *pEVar3;
  Exception *params_1;
  anon_class_24_3_f55ba8ed *func;
  String local_3c0;
  ArrayPtr<const_char> local_3a8;
  Exception *local_390;
  Exception *exception;
  undefined1 local_378 [432];
  undefined1 local_1c8 [8];
  NullableValue<kj::Exception> _exception655;
  Content *content;
  CompiledModule *local_20;
  Content *_content647;
  SchemaLoader *loader_local;
  Node *this_local;
  
  _content647 = (Content *)loader;
  loader_local = (SchemaLoader *)this;
  getContent((Node *)&content,(State)this);
  local_378._0_8_ =
       kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                 ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&content);
  if ((CompiledModule *)local_378._0_8_ != (CompiledModule *)0x0) {
    local_378._8_8_ = _content647;
    params_1 = (Exception *)_content647;
    local_378._16_8_ = this;
    _exception655.field_1.value.details.builder.disposer = (ArrayDisposer *)local_378._0_8_;
    local_20 = (CompiledModule *)local_378._0_8_;
    kj::
    runCatchingExceptions<capnp::compiler::Compiler::Node::loadFinalSchema(capnp::SchemaLoader_const&)::__0>
              ((Maybe<kj::Exception> *)(local_378 + 0x18),(kj *)local_378,func);
    other = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_378 + 0x18));
    kj::_::NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)local_1c8,other);
    kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_378 + 0x18));
    pEVar2 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1c8);
    if (pEVar2 != (Exception *)0x0) {
      local_390 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_1c8);
      kj::Maybe<capnp::schema::Node::Reader>::operator=
                ((Maybe<capnp::schema::Node::Reader> *)
                 (_exception655.field_1.value.details.builder.disposer + 0x14));
      pEVar3 = CompiledModule::getErrorReporter(this->module);
      uVar1 = (*pEVar3->_vptr_ErrorReporter[1])();
      if ((uVar1 & 1) == 0) {
        kj::str<char_const(&)[50],kj::Exception&>
                  (&local_3c0,(kj *)"Internal compiler bug: Schema failed validation:\n",
                   (char (*) [50])local_390,params_1);
        kj::StringPtr::StringPtr((StringPtr *)&local_3a8,&local_3c0);
        addError(this,(StringPtr)local_3a8);
        kj::String::~String(&local_3c0);
      }
    }
    kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1c8);
  }
  return;
}

Assistant:

void Compiler::Node::loadFinalSchema(const SchemaLoader& loader) {
  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        KJ_MAP(auxSchema, content.auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content.finalSchema = kj::none;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", exception));
      }
    }
  }
}